

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteSweepShadingPatternObject
          (ShadingWriter *this,double inCX,double inCY,double inStartAngleRad,double inEndAngleRad,
          InterpretedGradientStopList *inColorLine,FT_PaintExtend inGradientExtend,
          PDFRectangle *inBounds,PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *this_00;
  bool bVar1;
  EStatusCode EVar2;
  ShadingWriter *this_01;
  SweepShading sweepParams;
  SweepShading local_70;
  
  this_00 = &local_70.colorLine;
  this_01 = (ShadingWriter *)this_00;
  local_70.cX = inCX;
  local_70.cY = inCY;
  local_70.startAngleRad = inStartAngleRad;
  local_70.endAngleRad = inEndAngleRad;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            (this_00,inColorLine);
  local_70.gradientExtend = inGradientExtend;
  bVar1 = ColorLineHasTransparency(this_01,inColorLine);
  if (bVar1) {
    EVar2 = WriteRGBATiledPatternObject(this,&local_70,inBounds,inMatrix,inPatternObjectId);
  }
  else {
    EVar2 = WriteShadingPatternObjectWithPDFCustomFunctions
                      (this,&local_70,inBounds,inMatrix,inPatternObjectId);
  }
  std::__cxx11::_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::
  _M_clear(&this_00->
            super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>);
  return EVar2;
}

Assistant:

EStatusCode ShadingWriter::WriteSweepShadingPatternObject(
    double inCX,
    double inCY,
    double inStartAngleRad,
    double inEndAngleRad,
    const InterpretedGradientStopList& inColorLine,
    FT_PaintExtend inGradientExtend,
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId) {

    // Note: at this point start and end angles are ignored. 0..360 is the range used at all times.
    // As a side effect this also means there's no support for extend, as the full range is always implemented.
    SweepShading sweepParams = {
        inCX,
        inCY,
        inStartAngleRad,
        inEndAngleRad,
        inColorLine,
        inGradientExtend
    };

    if(ColorLineHasTransparency(inColorLine))
        return WriteRGBATiledPatternObject(sweepParams, inBounds, inMatrix, inPatternObjectId);
    else
        return WriteRGBShadingPatternObject(sweepParams, inBounds, inMatrix, inPatternObjectId);

}